

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index_stats.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  ostream *poVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  allocator local_199;
  shared_ptr<const_pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>
  index;
  stats s;
  string local_158 [32];
  database db;
  
  std::__cxx11::string::string
            ((string *)&db,"Dumps statistics for the indexes in a pstore database",(allocator *)&s);
  pstore::command_line::parse_command_line_options(argc,argv,(string *)&db);
  std::__cxx11::string::~string((string *)&db);
  pstore::database::database
            (&db,(string *)((anonymous_namespace)::db_path_abi_cxx11_ + 0x88),read_only,true);
  pstore::database::sync(&db);
  std::operator<<((ostream *)&std::cout,"name,branching-factor,mean-leaf-depth,max-depth,size\n");
  pstore::index::
  get_index<(pstore::trailer::indices)0,pstore::database_const,pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::compilation>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>const>
            ((index *)&index,&db,false);
  if (index.
      super___shared_ptr<const_pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr != (element_type *)0x0) {
    s.internal_out_edges_ = 0;
    s.internal_visited_ = 0;
    s.leaf_depth_ = 0;
    s.leaves_visited_ = 0;
    s.max_depth_ = 0;
    s.db_ = &db;
    anon_unknown.dwarf_ffaa::stats::traverse
              (&s,(index.
                   super___shared_ptr<const_pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr)->root_);
    std::__cxx11::string::string(local_158,"compilation",&local_199);
    poVar1 = std::operator<<((ostream *)&std::cout,local_158);
    std::operator<<(poVar1,",");
    dVar2 = 0.0;
    if (s.internal_visited_ != 0) {
      auVar3._8_4_ = (int)(s.internal_out_edges_ >> 0x20);
      auVar3._0_8_ = s.internal_out_edges_;
      auVar3._12_4_ = 0x45300000;
      auVar4._8_4_ = (int)(s.internal_visited_ >> 0x20);
      auVar4._0_8_ = s.internal_visited_;
      auVar4._12_4_ = 0x45300000;
      dVar2 = ((auVar3._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)s.internal_out_edges_) - 4503599627370496.0)) /
              ((auVar4._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)s.internal_visited_) - 4503599627370496.0));
    }
    poVar1 = std::ostream::_M_insert<double>(dVar2);
    std::operator<<(poVar1,",");
    dVar2 = 0.0;
    if (s.leaves_visited_ != 0) {
      auVar5._8_4_ = (int)(s.leaf_depth_ >> 0x20);
      auVar5._0_8_ = s.leaf_depth_;
      auVar5._12_4_ = 0x45300000;
      auVar6._8_4_ = (int)(s.leaves_visited_ >> 0x20);
      auVar6._0_8_ = s.leaves_visited_;
      auVar6._12_4_ = 0x45300000;
      dVar2 = ((auVar5._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)s.leaf_depth_) - 4503599627370496.0)) /
              ((auVar6._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)s.leaves_visited_) - 4503599627370496.0));
    }
    poVar1 = std::ostream::_M_insert<double>(dVar2);
    poVar1 = std::operator<<(poVar1,",");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    poVar1 = std::operator<<(poVar1,",");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<(poVar1,"\n");
    std::__cxx11::string::~string(local_158);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&index.
              super___shared_ptr<const_pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  pstore::index::
  get_index<(pstore::trailer::indices)1,pstore::database_const,pstore::index::hamt_map<pstore::uint128,pstore::extent<unsigned_char>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>const>
            ((index *)&index,&db,false);
  if (index.
      super___shared_ptr<const_pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr != (element_type *)0x0) {
    s.internal_out_edges_ = 0;
    s.internal_visited_ = 0;
    s.leaf_depth_ = 0;
    s.leaves_visited_ = 0;
    s.max_depth_ = 0;
    s.db_ = &db;
    anon_unknown.dwarf_ffaa::stats::traverse
              (&s,(index.
                   super___shared_ptr<const_pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr)->root_);
    std::__cxx11::string::string(local_158,"debug_line_header",&local_199);
    poVar1 = std::operator<<((ostream *)&std::cout,local_158);
    std::operator<<(poVar1,",");
    dVar2 = 0.0;
    if (s.internal_visited_ != 0) {
      auVar7._8_4_ = (int)(s.internal_out_edges_ >> 0x20);
      auVar7._0_8_ = s.internal_out_edges_;
      auVar7._12_4_ = 0x45300000;
      auVar8._8_4_ = (int)(s.internal_visited_ >> 0x20);
      auVar8._0_8_ = s.internal_visited_;
      auVar8._12_4_ = 0x45300000;
      dVar2 = ((auVar7._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)s.internal_out_edges_) - 4503599627370496.0)) /
              ((auVar8._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)s.internal_visited_) - 4503599627370496.0));
    }
    poVar1 = std::ostream::_M_insert<double>(dVar2);
    std::operator<<(poVar1,",");
    dVar2 = 0.0;
    if (s.leaves_visited_ != 0) {
      auVar9._8_4_ = (int)(s.leaf_depth_ >> 0x20);
      auVar9._0_8_ = s.leaf_depth_;
      auVar9._12_4_ = 0x45300000;
      auVar10._8_4_ = (int)(s.leaves_visited_ >> 0x20);
      auVar10._0_8_ = s.leaves_visited_;
      auVar10._12_4_ = 0x45300000;
      dVar2 = ((auVar9._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)s.leaf_depth_) - 4503599627370496.0)) /
              ((auVar10._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)s.leaves_visited_) - 4503599627370496.0));
    }
    poVar1 = std::ostream::_M_insert<double>(dVar2);
    poVar1 = std::operator<<(poVar1,",");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    poVar1 = std::operator<<(poVar1,",");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<(poVar1,"\n");
    std::__cxx11::string::~string(local_158);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&index.
              super___shared_ptr<const_pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  pstore::index::
  get_index<(pstore::trailer::indices)2,pstore::database_const,pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::fragment>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>const>
            ((index *)&index,&db,false);
  if (index.
      super___shared_ptr<const_pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr != (element_type *)0x0) {
    s.internal_out_edges_ = 0;
    s.internal_visited_ = 0;
    s.leaf_depth_ = 0;
    s.leaves_visited_ = 0;
    s.max_depth_ = 0;
    s.db_ = &db;
    anon_unknown.dwarf_ffaa::stats::traverse
              (&s,(index.
                   super___shared_ptr<const_pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr)->root_);
    std::__cxx11::string::string(local_158,"fragment",&local_199);
    poVar1 = std::operator<<((ostream *)&std::cout,local_158);
    std::operator<<(poVar1,",");
    dVar2 = 0.0;
    if (s.internal_visited_ != 0) {
      auVar11._8_4_ = (int)(s.internal_out_edges_ >> 0x20);
      auVar11._0_8_ = s.internal_out_edges_;
      auVar11._12_4_ = 0x45300000;
      auVar12._8_4_ = (int)(s.internal_visited_ >> 0x20);
      auVar12._0_8_ = s.internal_visited_;
      auVar12._12_4_ = 0x45300000;
      dVar2 = ((auVar11._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)s.internal_out_edges_) - 4503599627370496.0)) /
              ((auVar12._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)s.internal_visited_) - 4503599627370496.0));
    }
    poVar1 = std::ostream::_M_insert<double>(dVar2);
    std::operator<<(poVar1,",");
    dVar2 = 0.0;
    if (s.leaves_visited_ != 0) {
      auVar13._8_4_ = (int)(s.leaf_depth_ >> 0x20);
      auVar13._0_8_ = s.leaf_depth_;
      auVar13._12_4_ = 0x45300000;
      auVar14._8_4_ = (int)(s.leaves_visited_ >> 0x20);
      auVar14._0_8_ = s.leaves_visited_;
      auVar14._12_4_ = 0x45300000;
      dVar2 = ((auVar13._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)s.leaf_depth_) - 4503599627370496.0)) /
              ((auVar14._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)s.leaves_visited_) - 4503599627370496.0));
    }
    poVar1 = std::ostream::_M_insert<double>(dVar2);
    poVar1 = std::operator<<(poVar1,",");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    poVar1 = std::operator<<(poVar1,",");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<(poVar1,"\n");
    std::__cxx11::string::~string(local_158);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&index.
              super___shared_ptr<const_pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  pstore::index::
  get_index<(pstore::trailer::indices)3,pstore::database_const,pstore::index::hamt_set<pstore::indirect_string,pstore::index::fnv_64a_hash_indirect_string,std::equal_to<pstore::indirect_string>>const>
            ((index *)&index,&db,false);
  if (index.
      super___shared_ptr<const_pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr != (element_type *)0x0) {
    s.internal_out_edges_ = 0;
    s.internal_visited_ = 0;
    s.leaf_depth_ = 0;
    s.leaves_visited_ = 0;
    s.max_depth_ = 0;
    s.db_ = &db;
    (anonymous_namespace)::stats::
    traverse<pstore::indirect_string,pstore::index::fnv_64a_hash_indirect_string,std::equal_to<pstore::indirect_string>>
              ((stats *)&s,
               (hamt_set<pstore::indirect_string,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>
                *)index.
                  super___shared_ptr<const_pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr);
    std::__cxx11::string::string(local_158,"name",&local_199);
    poVar1 = std::operator<<((ostream *)&std::cout,local_158);
    std::operator<<(poVar1,",");
    dVar2 = 0.0;
    if (s.internal_visited_ != 0) {
      auVar15._8_4_ = (int)(s.internal_out_edges_ >> 0x20);
      auVar15._0_8_ = s.internal_out_edges_;
      auVar15._12_4_ = 0x45300000;
      auVar16._8_4_ = (int)(s.internal_visited_ >> 0x20);
      auVar16._0_8_ = s.internal_visited_;
      auVar16._12_4_ = 0x45300000;
      dVar2 = ((auVar15._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)s.internal_out_edges_) - 4503599627370496.0)) /
              ((auVar16._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)s.internal_visited_) - 4503599627370496.0));
    }
    poVar1 = std::ostream::_M_insert<double>(dVar2);
    std::operator<<(poVar1,",");
    dVar2 = 0.0;
    if (s.leaves_visited_ != 0) {
      auVar17._8_4_ = (int)(s.leaf_depth_ >> 0x20);
      auVar17._0_8_ = s.leaf_depth_;
      auVar17._12_4_ = 0x45300000;
      auVar18._8_4_ = (int)(s.leaves_visited_ >> 0x20);
      auVar18._0_8_ = s.leaves_visited_;
      auVar18._12_4_ = 0x45300000;
      dVar2 = ((auVar17._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)s.leaf_depth_) - 4503599627370496.0)) /
              ((auVar18._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)s.leaves_visited_) - 4503599627370496.0));
    }
    poVar1 = std::ostream::_M_insert<double>(dVar2);
    poVar1 = std::operator<<(poVar1,",");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    poVar1 = std::operator<<(poVar1,",");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<(poVar1,"\n");
    std::__cxx11::string::~string(local_158);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&index.
              super___shared_ptr<const_pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  pstore::index::
  get_index<(pstore::trailer::indices)4,pstore::database_const,pstore::index::hamt_set<pstore::indirect_string,pstore::index::fnv_64a_hash_indirect_string,std::equal_to<pstore::indirect_string>>const>
            ((index *)&index,&db,false);
  if (index.
      super___shared_ptr<const_pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr != (element_type *)0x0) {
    s.internal_out_edges_ = 0;
    s.internal_visited_ = 0;
    s.leaf_depth_ = 0;
    s.leaves_visited_ = 0;
    s.max_depth_ = 0;
    s.db_ = &db;
    (anonymous_namespace)::stats::
    traverse<pstore::indirect_string,pstore::index::fnv_64a_hash_indirect_string,std::equal_to<pstore::indirect_string>>
              ((stats *)&s,
               (hamt_set<pstore::indirect_string,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>
                *)index.
                  super___shared_ptr<const_pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr);
    std::__cxx11::string::string(local_158,"path",&local_199);
    poVar1 = std::operator<<((ostream *)&std::cout,local_158);
    std::operator<<(poVar1,",");
    dVar2 = 0.0;
    if (s.internal_visited_ != 0) {
      auVar19._8_4_ = (int)(s.internal_out_edges_ >> 0x20);
      auVar19._0_8_ = s.internal_out_edges_;
      auVar19._12_4_ = 0x45300000;
      auVar20._8_4_ = (int)(s.internal_visited_ >> 0x20);
      auVar20._0_8_ = s.internal_visited_;
      auVar20._12_4_ = 0x45300000;
      dVar2 = ((auVar19._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)s.internal_out_edges_) - 4503599627370496.0)) /
              ((auVar20._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)s.internal_visited_) - 4503599627370496.0));
    }
    poVar1 = std::ostream::_M_insert<double>(dVar2);
    std::operator<<(poVar1,",");
    dVar2 = 0.0;
    if (s.leaves_visited_ != 0) {
      auVar21._8_4_ = (int)(s.leaf_depth_ >> 0x20);
      auVar21._0_8_ = s.leaf_depth_;
      auVar21._12_4_ = 0x45300000;
      auVar22._8_4_ = (int)(s.leaves_visited_ >> 0x20);
      auVar22._0_8_ = s.leaves_visited_;
      auVar22._12_4_ = 0x45300000;
      dVar2 = ((auVar21._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)s.leaf_depth_) - 4503599627370496.0)) /
              ((auVar22._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)s.leaves_visited_) - 4503599627370496.0));
    }
    poVar1 = std::ostream::_M_insert<double>(dVar2);
    poVar1 = std::operator<<(poVar1,",");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    poVar1 = std::operator<<(poVar1,",");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<(poVar1,"\n");
    std::__cxx11::string::~string(local_158);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&index.
              super___shared_ptr<const_pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  pstore::index::
  get_index<(pstore::trailer::indices)5,pstore::database_const,pstore::index::hamt_map<std::__cxx11::string,pstore::extent<char>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>const>
            ((index *)&index,&db,false);
  if (index.
      super___shared_ptr<const_pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr != (element_type *)0x0) {
    s.internal_out_edges_ = 0;
    s.internal_visited_ = 0;
    s.leaf_depth_ = 0;
    s.leaves_visited_ = 0;
    s.max_depth_ = 0;
    s.db_ = &db;
    anon_unknown.dwarf_ffaa::stats::traverse
              (&s,(index.
                   super___shared_ptr<const_pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr)->root_);
    std::__cxx11::string::string(local_158,"write",&local_199);
    poVar1 = std::operator<<((ostream *)&std::cout,local_158);
    std::operator<<(poVar1,",");
    dVar2 = 0.0;
    if (s.internal_visited_ != 0) {
      auVar23._8_4_ = (int)(s.internal_out_edges_ >> 0x20);
      auVar23._0_8_ = s.internal_out_edges_;
      auVar23._12_4_ = 0x45300000;
      auVar24._8_4_ = (int)(s.internal_visited_ >> 0x20);
      auVar24._0_8_ = s.internal_visited_;
      auVar24._12_4_ = 0x45300000;
      dVar2 = ((auVar23._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)s.internal_out_edges_) - 4503599627370496.0)) /
              ((auVar24._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)s.internal_visited_) - 4503599627370496.0));
    }
    poVar1 = std::ostream::_M_insert<double>(dVar2);
    std::operator<<(poVar1,",");
    dVar2 = 0.0;
    if (s.leaves_visited_ != 0) {
      auVar25._8_4_ = (int)(s.leaf_depth_ >> 0x20);
      auVar25._0_8_ = s.leaf_depth_;
      auVar25._12_4_ = 0x45300000;
      auVar26._8_4_ = (int)(s.leaves_visited_ >> 0x20);
      auVar26._0_8_ = s.leaves_visited_;
      auVar26._12_4_ = 0x45300000;
      dVar2 = ((auVar25._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)s.leaf_depth_) - 4503599627370496.0)) /
              ((auVar26._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)s.leaves_visited_) - 4503599627370496.0));
    }
    poVar1 = std::ostream::_M_insert<double>(dVar2);
    poVar1 = std::operator<<(poVar1,",");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    poVar1 = std::operator<<(poVar1,",");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<(poVar1,"\n");
    std::__cxx11::string::~string(local_158);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&index.
              super___shared_ptr<const_pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  pstore::database::~database(&db);
  return 0;
}

Assistant:

int main (int argc, char * argv[]) {
#endif
    int exit_code = EXIT_SUCCESS;

    PSTORE_TRY {
        command_line::parse_command_line_options (
            argc, argv, "Dumps statistics for the indexes in a pstore database");

        database db{db_path.get (), database::access_mode::read_only};
        db.sync (static_cast<unsigned> (revision.get ()));

        command_line::out_stream << PSTORE_NATIVE_TEXT (
            "name,branching-factor,mean-leaf-depth,max-depth,size\n");
#define X(a) dump_index_stats<trailer::indices::a> (db);
        PSTORE_INDICES
#undef X
    }